

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O2

uint __thiscall
ThreeWiseHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (ThreeWiseHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  long lVar1;
  size_type sVar2;
  byte *pbVar3;
  uint uVar4;
  size_t k;
  ulong __n;
  long lVar5;
  
  lVar5 = 0;
  uVar4 = 0;
  __n = 0;
  while( true ) {
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar2 <= __n) break;
    lVar1 = *(long *)(this + 0x60);
    pbVar3 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,__n);
    uVar4 = uVar4 ^ *(uint *)(lVar5 + lVar1 + (ulong)*pbVar3 * 4);
    __n = __n + 1;
    lVar5 = lVar5 + 0x400;
  }
  return uVar4;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (size_t k = 0; k < c.size(); ++k) {
      answer ^= hashers[k].hashvalues[c[k]];
    }
    return answer;
  }